

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O2

void mi_segment_commit_mask
               (mi_segment_t *segment,_Bool conservative,uint8_t *p,size_t size,uint8_t **start_p,
               size_t *full_size,mi_commit_mask_t *cm)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  mi_commit_mask_create_empty(cm);
  if (((0xfffffffffdffffff < size - 0x2000001) && (segment->kind != MI_SEGMENT_HUGE)) &&
     (uVar2 = segment->segment_slices * 0x10000, p < (uint8_t *)(uVar2 + (long)segment))) {
    uVar4 = segment->segment_info_slices << 0x10;
    uVar5 = (long)p - (long)segment;
    uVar6 = uVar5 + 0xffff;
    sVar1 = size;
    if (!conservative) {
      uVar6 = uVar5;
      sVar1 = size + 0xffff;
    }
    uVar6 = uVar6 & 0xffffffffffff0000;
    uVar7 = sVar1 + uVar5 & 0xffffffffffff0000;
    uVar3 = uVar4;
    if (uVar4 < uVar6) {
      uVar3 = uVar6;
    }
    if (uVar5 < uVar4) {
      uVar3 = uVar6;
    }
    if (uVar2 <= uVar7) {
      uVar7 = uVar2;
    }
    *start_p = (uint8_t *)((long)(segment->purge_mask).mask + (uVar3 - 0x38));
    uVar2 = 0;
    if (uVar3 <= uVar7) {
      uVar2 = uVar7 - uVar3;
    }
    *full_size = uVar2;
    if (uVar3 <= uVar7 && uVar7 - uVar3 != 0) {
      uVar6 = uVar3 >> 0x10;
      uVar4 = uVar2 >> 0x10;
      if (0x200 < uVar6 + uVar4) {
        _mi_warning_message("commit mask overflow: idx=%zu count=%zu start=%zx end=%zx p=0x%p size=%zu fullsize=%zu\n"
                            ,uVar6,uVar4,uVar3,uVar7,p,size,uVar2);
      }
      mi_commit_mask_create(uVar6,uVar4,cm);
      return;
    }
  }
  return;
}

Assistant:

static void mi_segment_commit_mask(mi_segment_t* segment, bool conservative, uint8_t* p, size_t size, uint8_t** start_p, size_t* full_size, mi_commit_mask_t* cm) {
  mi_assert_internal(_mi_ptr_segment(p + 1) == segment);
  mi_assert_internal(segment->kind != MI_SEGMENT_HUGE);
  mi_commit_mask_create_empty(cm);
  if (size == 0 || size > MI_SEGMENT_SIZE || segment->kind == MI_SEGMENT_HUGE) return;
  const size_t segstart = mi_segment_info_size(segment);
  const size_t segsize = mi_segment_size(segment);
  if (p >= (uint8_t*)segment + segsize) return;

  size_t pstart = (p - (uint8_t*)segment);
  mi_assert_internal(pstart + size <= segsize);

  size_t start;
  size_t end;
  if (conservative) {
    // decommit conservative
    start = _mi_align_up(pstart, MI_COMMIT_SIZE);
    end   = _mi_align_down(pstart + size, MI_COMMIT_SIZE);
    mi_assert_internal(start >= segstart);
    mi_assert_internal(end <= segsize);
  }
  else {
    // commit liberal
    start = _mi_align_down(pstart, MI_MINIMAL_COMMIT_SIZE);
    end   = _mi_align_up(pstart + size, MI_MINIMAL_COMMIT_SIZE);
  }
  if (pstart >= segstart && start < segstart) {  // note: the mask is also calculated for an initial commit of the info area
    start = segstart;
  }
  if (end > segsize) {
    end = segsize;
  }

  mi_assert_internal(start <= pstart && (pstart + size) <= end);
  mi_assert_internal(start % MI_COMMIT_SIZE==0 && end % MI_COMMIT_SIZE == 0);
  *start_p   = (uint8_t*)segment + start;
  *full_size = (end > start ? end - start : 0);
  if (*full_size == 0) return;

  size_t bitidx = start / MI_COMMIT_SIZE;
  mi_assert_internal(bitidx < MI_COMMIT_MASK_BITS);

  size_t bitcount = *full_size / MI_COMMIT_SIZE; // can be 0
  if (bitidx + bitcount > MI_COMMIT_MASK_BITS) {
    _mi_warning_message("commit mask overflow: idx=%zu count=%zu start=%zx end=%zx p=0x%p size=%zu fullsize=%zu\n", bitidx, bitcount, start, end, p, size, *full_size);
  }
  mi_assert_internal((bitidx + bitcount) <= MI_COMMIT_MASK_BITS);
  mi_commit_mask_create(bitidx, bitcount, cm);
}